

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_means_template.h
# Opt level: O1

void av1_k_means_dim2(int16_t *data,int16_t *centroids,uint8_t *indices,int n,int k,int max_itr)

{
  int16_t *__s1;
  uint8_t *puVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int16_t *piVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  int64_t this_dist;
  uint8_t *meta_indices [2];
  int16_t *meta_centroids [2];
  int count [8];
  int16_t centroids_tmp [16];
  int centroids_sum [16];
  uint8_t indices_tmp [4096];
  int local_1140;
  long local_1130;
  long local_1128;
  int16_t *local_1120;
  uint8_t *local_1118;
  ulong local_1110;
  uint8_t *local_1108 [5];
  size_t local_10e0;
  size_t local_10d8;
  long local_10d0;
  ulong local_10c8;
  ulong local_10c0;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [32];
  undefined8 local_1078 [8];
  undefined1 local_1038 [4104];
  
  local_1108[3] = local_1098;
  local_1108[1] = local_1038;
  local_1108[0] = indices;
  local_1108[2] = (uint8_t *)centroids;
  (*av1_calc_indices_dim2)(data,centroids,indices,&local_1130,n,k);
  lVar8 = (long)k;
  if (max_itr < 1) {
    uVar10 = 0;
    local_1140 = 0;
    iVar3 = 0;
  }
  else {
    local_10d8 = lVar8 * 8;
    local_10e0 = lVar8 * 4;
    uVar4 = 0;
    local_1140 = 0;
    uVar10 = 0;
    local_1128 = lVar8;
    local_1120 = centroids;
    local_1118 = indices;
    do {
      local_10d0 = local_1130;
      local_10c0 = (ulong)((uint)uVar10 ^ 1);
      __s1 = (int16_t *)local_1108[local_10c0 + 2];
      local_10c8 = uVar10 & 0xffffffff;
      puVar1 = local_1108[uVar10 & 0xffffffff];
      local_10a8 = (undefined1  [16])0x0;
      local_10b8 = (undefined1  [16])0x0;
      uVar12 = (uint)*data;
      local_1110 = uVar4;
      memset(local_1078,0,local_10d8);
      uVar10 = local_10c0;
      uVar4 = local_10c8;
      if (0 < n) {
        uVar5 = 0;
        do {
          uVar6 = (ulong)puVar1[uVar5];
          *(int *)(local_10b8 + uVar6 * 4) = *(int *)(local_10b8 + uVar6 * 4) + 1;
          auVar13 = pshuflw(ZEXT416(*(uint *)(data + uVar5 * 2)),
                            ZEXT416(*(uint *)(data + uVar5 * 2)),0x60);
          local_1078[uVar6] =
               CONCAT44((int)((ulong)local_1078[uVar6] >> 0x20) + (auVar13._4_4_ >> 0x10),
                        (int)local_1078[uVar6] + (auVar13._0_4_ >> 0x10));
          uVar5 = uVar5 + 1;
        } while ((uint)n != uVar5);
      }
      if (0 < k) {
        puVar7 = local_1078;
        uVar5 = 0;
        piVar11 = __s1;
        do {
          iVar3 = *(int *)(local_10b8 + uVar5 * 4);
          if (iVar3 == 0) {
            uVar12 = uVar12 * 0x41c64e6d + 0x3039;
            *(undefined4 *)(__s1 + uVar5 * 2) =
                 *(undefined4 *)((long)data + (ulong)((uVar12 >> 0x10 & 0x7fff) % (uint)n << 2));
          }
          else {
            lVar8 = 0;
            do {
              piVar11[lVar8] =
                   (int16_t)((*(int *)((long)puVar7 + lVar8 * 4) + (iVar3 >> 1)) / iVar3);
              lVar8 = lVar8 + 1;
            } while (lVar8 == 1);
          }
          uVar5 = uVar5 + 1;
          piVar11 = piVar11 + 2;
          puVar7 = puVar7 + 1;
        } while (uVar5 != (uint)k);
      }
      iVar3 = bcmp(__s1,local_1108[local_10c8 + 2],local_10e0);
      if (iVar3 == 0) {
        bVar2 = false;
        iVar3 = local_1140;
      }
      else {
        (*av1_calc_indices_dim2)(data,__s1,local_1108[uVar10],&local_1130,n,k);
        bVar2 = local_1130 <= local_10d0;
        iVar3 = (int)uVar4;
        if (local_1130 <= local_10d0) {
          iVar3 = local_1140;
        }
      }
      local_1140 = iVar3;
      lVar8 = local_1128;
      indices = local_1118;
      centroids = local_1120;
      iVar3 = (int)local_1110;
    } while ((bVar2) &&
            (uVar12 = (int)local_1110 + 1, uVar4 = (ulong)uVar12, iVar3 = max_itr, uVar12 != max_itr
            ));
  }
  iVar9 = (int)uVar10;
  if (iVar3 != max_itr) {
    iVar9 = local_1140;
  }
  if (iVar9 != 0) {
    memcpy(centroids,local_1098,lVar8 << 2);
    memcpy(indices,local_1038,(long)n);
  }
  return;
}

Assistant:

void RENAME(av1_k_means)(const int16_t *data, int16_t *centroids,
                         uint8_t *indices, int n, int k, int max_itr) {
  int16_t centroids_tmp[AV1_K_MEANS_DIM * PALETTE_MAX_SIZE];
  uint8_t indices_tmp[MAX_PALETTE_BLOCK_WIDTH * MAX_PALETTE_BLOCK_HEIGHT];
  int16_t *meta_centroids[2] = { centroids, centroids_tmp };
  uint8_t *meta_indices[2] = { indices, indices_tmp };
  int i, l = 0, prev_l, best_l = 0;
  int64_t this_dist;

  assert(n <= MAX_PALETTE_BLOCK_WIDTH * MAX_PALETTE_BLOCK_HEIGHT);

#if AV1_K_MEANS_DIM == 1
  av1_calc_indices_dim1(data, centroids, indices, &this_dist, n, k);
#else
  av1_calc_indices_dim2(data, centroids, indices, &this_dist, n, k);
#endif

  for (i = 0; i < max_itr; ++i) {
    const int64_t prev_dist = this_dist;
    prev_l = l;
    l = (l == 1) ? 0 : 1;

    RENAME(calc_centroids)(data, meta_centroids[l], meta_indices[prev_l], n, k);
    if (!memcmp(meta_centroids[l], meta_centroids[prev_l],
                sizeof(centroids[0]) * k * AV1_K_MEANS_DIM)) {
      break;
    }
#if AV1_K_MEANS_DIM == 1
    av1_calc_indices_dim1(data, meta_centroids[l], meta_indices[l], &this_dist,
                          n, k);
#else
    av1_calc_indices_dim2(data, meta_centroids[l], meta_indices[l], &this_dist,
                          n, k);
#endif

    if (this_dist > prev_dist) {
      best_l = prev_l;
      break;
    }
  }
  if (i == max_itr) best_l = l;
  if (best_l != 0) {
    memcpy(centroids, meta_centroids[1],
           sizeof(centroids[0]) * k * AV1_K_MEANS_DIM);
    memcpy(indices, meta_indices[1], sizeof(indices[0]) * n);
  }
}